

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_tos_al(void)

{
  uint uVar1;
  
  if (m68ki_cpu.s_flag != 0) {
    uVar1 = OPER_AL_16();
    m68ki_set_sr(uVar1);
    return;
  }
  uVar1 = m68ki_init_exception();
  m68ki_stack_frame_0000(m68ki_cpu.ppc,uVar1,8);
  m68ki_jump_vector(8);
  m68ki_remaining_cycles =
       m68ki_remaining_cycles +
       ((uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir] - (uint)m68ki_cpu.cyc_exception[8]);
  return;
}

Assistant:

static void m68k_op_move_16_tos_al(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_AL_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(new_sr);
		return;
	}
	m68ki_exception_privilege_violation();
}